

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool absl::lts_20250127::debugging_internal::ParseTopLevelMangledName(State *state)

{
  ComplexityGuard state_00;
  bool bVar1;
  char *pcVar2;
  ComplexityGuard local_20;
  ComplexityGuard guard;
  State *state_local;
  
  guard.state_ = state;
  anon_unknown_3::ComplexityGuard::ComplexityGuard(&local_20,state);
  bVar1 = anon_unknown_3::ComplexityGuard::IsTooComplex(&local_20);
  if (bVar1) {
    state_local._7_1_ = false;
  }
  else {
    bVar1 = ParseMangledName(guard.state_);
    if (bVar1) {
      pcVar2 = RemainingInput(guard.state_);
      if (*pcVar2 == '\0') {
        state_local._7_1_ = true;
      }
      else {
        pcVar2 = RemainingInput(guard.state_);
        bVar1 = IsFunctionCloneSuffix(pcVar2);
        if (bVar1) {
          state_local._7_1_ = true;
        }
        else {
          pcVar2 = RemainingInput(guard.state_);
          state_00 = guard;
          if (*pcVar2 == '@') {
            pcVar2 = RemainingInput(guard.state_);
            MaybeAppend(state_00.state_,pcVar2);
            state_local._7_1_ = true;
          }
          else {
            anon_unknown_3::ReportHighWaterMark(guard.state_);
            state_local._7_1_ = false;
          }
        }
      }
    }
    else {
      anon_unknown_3::ReportHighWaterMark(guard.state_);
      state_local._7_1_ = false;
    }
  }
  anon_unknown_3::ComplexityGuard::~ComplexityGuard(&local_20);
  return state_local._7_1_;
}

Assistant:

static bool ParseTopLevelMangledName(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  if (ParseMangledName(state)) {
    if (RemainingInput(state)[0] != '\0') {
      // Drop trailing function clone suffix, if any.
      if (IsFunctionCloneSuffix(RemainingInput(state))) {
        return true;
      }
      // Append trailing version suffix if any.
      // ex. _Z3foo@@GLIBCXX_3.4
      if (RemainingInput(state)[0] == '@') {
        MaybeAppend(state, RemainingInput(state));
        return true;
      }
      ReportHighWaterMark(state);
      return false;  // Unconsumed suffix.
    }
    return true;
  }

  ReportHighWaterMark(state);
  return false;
}